

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix-test.c++
# Opt level: O2

void __thiscall kj::anon_unknown_0::TestCase161::run(TestCase161 *this)

{
  undefined1 in_CL;
  bool errors;
  bool errors_00;
  bool errors_01;
  bool errors_02;
  bool errors_03;
  bool errors_04;
  char *pcVar1;
  EncodingResult<kj::Array<char32_t>_> local_350;
  EncodingResult<kj::Array<char32_t>_> local_330;
  EncodingResult<kj::Array<char32_t>_> local_310;
  EncodingResult<kj::Array<char32_t>_> local_2f0;
  EncodingResult<kj::Array<char32_t>_> local_2d0;
  EncodingResult<kj::Array<char32_t>_> local_2b0;
  EncodingResult<kj::Array<char32_t>_> local_290;
  EncodingResult<kj::Array<char32_t>_> local_270;
  EncodingResult<kj::Array<char32_t>_> local_250;
  EncodingResult<kj::Array<char32_t>_> local_230;
  EncodingResult<kj::Array<char32_t>_> local_210;
  EncodingResult<kj::Array<char32_t>_> local_1f0;
  EncodingResult<kj::Array<char32_t>_> local_1d0;
  EncodingResult<kj::Array<char32_t>_> local_1b0;
  EncodingResult<kj::Array<char32_t>_> local_190;
  EncodingResult<kj::Array<char32_t>_> local_170;
  EncodingResult<kj::Array<char32_t>_> local_150;
  EncodingResult<kj::Array<char32_t>_> local_130;
  EncodingResult<kj::Array<char32_t>_> local_110;
  EncodingResult<kj::Array<char32_t>_> local_f0;
  EncodingResult<kj::Array<char32_t>_> local_d0;
  EncodingResult<kj::Array<char32_t>_> local_b0;
  EncodingResult<kj::Array<char32_t>_> local_90;
  EncodingResult<kj::Array<char32_t>_> local_70;
  EncodingResult<kj::Array<char32_t>_> local_50;
  EncodingResult<kj::Array<char32_t>_> local_30;
  
  encodeUtf32<2ul>(&local_30,(kj *)(anon_var_dwarf_32fcc9 + 7),(char (*) [2])0x0,(bool)in_CL);
  (anonymous_namespace)::expectRes<kj::Array<char32_t>,char32_t,2ul>
            (&local_30,&anon_var_dwarf_32fe09,true);
  Array<char32_t>::~Array(&local_30.super_Array<char32_t>);
  encodeUtf32<4ul>(&local_50,(kj *)anon_var_dwarf_32fb0d,(char (*) [4])0x0,(bool)in_CL);
  (anonymous_namespace)::expectRes<kj::Array<char32_t>,char32_t,4ul>
            (&local_50,&anon_var_dwarf_32fe22,true);
  Array<char32_t>::~Array(&local_50.super_Array<char32_t>);
  encodeUtf32<6ul>(&local_70,(kj *)anon_var_dwarf_32fb31,(char (*) [6])0x0,(bool)in_CL);
  (anonymous_namespace)::expectRes<kj::Array<char32_t>,char32_t,4ul>
            (&local_70,&anon_var_dwarf_32fe22,true);
  Array<char32_t>::~Array(&local_70.super_Array<char32_t>);
  pcVar1 = anon_var_dwarf_32fb3c;
  encodeUtf32<3ul>(&local_90,(kj *)anon_var_dwarf_32fb3c,(char (*) [3])0x0,(bool)in_CL);
  (anonymous_namespace)::expectRes<kj::Array<char32_t>,char32_t,3ul>
            (&local_90,(char32_t (*) [3])pcVar1,errors);
  Array<char32_t>::~Array(&local_90.super_Array<char32_t>);
  pcVar1 = anon_var_dwarf_32fb6e;
  encodeUtf32<3ul>(&local_b0,(kj *)anon_var_dwarf_32fb6e,(char (*) [3])0x0,(bool)in_CL);
  (anonymous_namespace)::expectRes<kj::Array<char32_t>,char32_t,3ul>
            (&local_b0,(char32_t (*) [3])pcVar1,errors_00);
  Array<char32_t>::~Array(&local_b0.super_Array<char32_t>);
  pcVar1 = anon_var_dwarf_32fb79;
  encodeUtf32<4ul>(&local_d0,(kj *)anon_var_dwarf_32fb79,(char (*) [4])0x0,(bool)in_CL);
  (anonymous_namespace)::expectRes<kj::Array<char32_t>,char32_t,3ul>
            (&local_d0,(char32_t (*) [3])pcVar1,errors_01);
  Array<char32_t>::~Array(&local_d0.super_Array<char32_t>);
  pcVar1 = anon_var_dwarf_32fb84;
  encodeUtf32<3ul>(&local_f0,(kj *)anon_var_dwarf_32fb84,(char (*) [3])0x0,(bool)in_CL);
  (anonymous_namespace)::expectRes<kj::Array<char32_t>,char32_t,3ul>
            (&local_f0,(char32_t (*) [3])pcVar1,errors_02);
  Array<char32_t>::~Array(&local_f0.super_Array<char32_t>);
  pcVar1 = anon_var_dwarf_32fb8f;
  encodeUtf32<4ul>(&local_110,(kj *)anon_var_dwarf_32fb8f,(char (*) [4])0x0,(bool)in_CL);
  (anonymous_namespace)::expectRes<kj::Array<char32_t>,char32_t,3ul>
            (&local_110,(char32_t (*) [3])pcVar1,errors_03);
  Array<char32_t>::~Array(&local_110.super_Array<char32_t>);
  pcVar1 = anon_var_dwarf_32fb9a;
  encodeUtf32<5ul>(&local_130,(kj *)anon_var_dwarf_32fb9a,(char (*) [5])0x0,(bool)in_CL);
  (anonymous_namespace)::expectRes<kj::Array<char32_t>,char32_t,3ul>
            (&local_130,(char32_t (*) [3])pcVar1,errors_04);
  Array<char32_t>::~Array(&local_130.super_Array<char32_t>);
  encodeUtf32<3ul>(&local_150,(kj *)anon_var_dwarf_32fba5,(char (*) [3])0x0,(bool)in_CL);
  (anonymous_namespace)::expectRes<kj::Array<char32_t>,char32_t,2ul>
            (&local_150,&anon_var_dwarf_32fe09,true);
  Array<char32_t>::~Array(&local_150.super_Array<char32_t>);
  encodeUtf32<3ul>(&local_170,(kj *)anon_var_dwarf_32fbb0,(char (*) [3])0x0,(bool)in_CL);
  (anonymous_namespace)::expectRes<kj::Array<char32_t>,char32_t,2ul>
            (&local_170,&anon_var_dwarf_32fe09,true);
  Array<char32_t>::~Array(&local_170.super_Array<char32_t>);
  encodeUtf32<3ul>(&local_190,(kj *)anon_var_dwarf_32fbbb,(char (*) [3])0x0,(bool)in_CL);
  (anonymous_namespace)::expectRes<kj::Array<char32_t>,char32_t,2ul>
            (&local_190,(char32_t (*) [2])L"\x80",false);
  Array<char32_t>::~Array(&local_190.super_Array<char32_t>);
  encodeUtf32<3ul>(&local_1b0,(kj *)anon_var_dwarf_32fbd1,(char (*) [3])0x0,(bool)in_CL);
  (anonymous_namespace)::expectRes<kj::Array<char32_t>,char32_t,2ul>
            (&local_1b0,(char32_t (*) [2])L"߿",false);
  Array<char32_t>::~Array(&local_1b0.super_Array<char32_t>);
  encodeUtf32<4ul>(&local_1d0,(kj *)anon_var_dwarf_32fbe7,(char (*) [4])0x0,(bool)in_CL);
  (anonymous_namespace)::expectRes<kj::Array<char32_t>,char32_t,2ul>
            (&local_1d0,&anon_var_dwarf_32fe09,true);
  Array<char32_t>::~Array(&local_1d0.super_Array<char32_t>);
  encodeUtf32<4ul>(&local_1f0,(kj *)anon_var_dwarf_32fbf2,(char (*) [4])0x0,(bool)in_CL);
  (anonymous_namespace)::expectRes<kj::Array<char32_t>,char32_t,2ul>
            (&local_1f0,&anon_var_dwarf_32fe09,true);
  Array<char32_t>::~Array(&local_1f0.super_Array<char32_t>);
  encodeUtf32<4ul>(&local_210,(kj *)anon_var_dwarf_32fbfd,(char (*) [4])0x0,(bool)in_CL);
  (anonymous_namespace)::expectRes<kj::Array<char32_t>,char32_t,2ul>
            (&local_210,(char32_t (*) [2])L"ࠀ",false);
  Array<char32_t>::~Array(&local_210.super_Array<char32_t>);
  encodeUtf32<4ul>(&local_230,(kj *)anon_var_dwarf_32fc29,(char (*) [4])0x0,(bool)in_CL);
  (anonymous_namespace)::expectRes<kj::Array<char32_t>,char32_t,2ul>
            (&local_230,(char32_t (*) [2])L"\xffff",false);
  Array<char32_t>::~Array(&local_230.super_Array<char32_t>);
  encodeUtf32<5ul>(&local_250,(kj *)anon_var_dwarf_32fc3f,(char (*) [5])0x0,(bool)in_CL);
  (anonymous_namespace)::expectRes<kj::Array<char32_t>,char32_t,2ul>
            (&local_250,&anon_var_dwarf_32fe09,true);
  Array<char32_t>::~Array(&local_250.super_Array<char32_t>);
  encodeUtf32<5ul>(&local_270,(kj *)anon_var_dwarf_32fc4a,(char (*) [5])0x0,(bool)in_CL);
  (anonymous_namespace)::expectRes<kj::Array<char32_t>,char32_t,2ul>
            (&local_270,&anon_var_dwarf_32fe09,true);
  Array<char32_t>::~Array(&local_270.super_Array<char32_t>);
  encodeUtf32<5ul>(&local_290,(kj *)anon_var_dwarf_32fc55,(char (*) [5])0x0,(bool)in_CL);
  (anonymous_namespace)::expectRes<kj::Array<char32_t>,char32_t,2ul>
            (&local_290,(char32_t (*) [2])L"𐀀",false);
  Array<char32_t>::~Array(&local_290.super_Array<char32_t>);
  encodeUtf32<5ul>(&local_2b0,(kj *)anon_var_dwarf_32fc6b,(char (*) [5])0x0,(bool)in_CL);
  (anonymous_namespace)::expectRes<kj::Array<char32_t>,char32_t,2ul>
            (&local_2b0,(char32_t (*) [2])L"\x0010ffff",false);
  Array<char32_t>::~Array(&local_2b0.super_Array<char32_t>);
  encodeUtf32<5ul>(&local_2d0,(kj *)anon_var_dwarf_32fc81,(char (*) [5])0x0,(bool)in_CL);
  (anonymous_namespace)::expectRes<kj::Array<char32_t>,char32_t,2ul>
            (&local_2d0,&anon_var_dwarf_32fe09,true);
  Array<char32_t>::~Array(&local_2d0.super_Array<char32_t>);
  encodeUtf32<6ul>(&local_2f0,(kj *)anon_var_dwarf_32fc8c,(char (*) [6])0x0,(bool)in_CL);
  (anonymous_namespace)::expectRes<kj::Array<char32_t>,char32_t,2ul>
            (&local_2f0,&anon_var_dwarf_32fe09,true);
  Array<char32_t>::~Array(&local_2f0.super_Array<char32_t>);
  encodeUtf32<7ul>(&local_310,(kj *)anon_var_dwarf_32fc97,(char (*) [7])0x0,(bool)in_CL);
  (anonymous_namespace)::expectRes<kj::Array<char32_t>,char32_t,2ul>
            (&local_310,&anon_var_dwarf_32fe09,true);
  Array<char32_t>::~Array(&local_310.super_Array<char32_t>);
  encodeUtf32<8ul>(&local_330,(kj *)anon_var_dwarf_32fcb0,(char (*) [8])0x0,(bool)in_CL);
  (anonymous_namespace)::expectRes<kj::Array<char32_t>,char32_t,2ul>
            (&local_330,&anon_var_dwarf_32fe09,true);
  Array<char32_t>::~Array(&local_330.super_Array<char32_t>);
  encodeUtf32<9ul>(&local_350,(kj *)anon_var_dwarf_32fcc9,(char (*) [9])0x0,(bool)in_CL);
  (anonymous_namespace)::expectRes<kj::Array<char32_t>,char32_t,2ul>
            (&local_350,&anon_var_dwarf_32fe09,true);
  Array<char32_t>::~Array(&local_350.super_Array<char32_t>);
  return;
}

Assistant:

TEST(AsyncUnixTest, SignalWithValue) {
  // This tests that if we use sigqueue() to attach a value to the signal, that value is received
  // correctly.  Note that this only works on platforms that support real-time signals -- even
  // though the signal we're sending is SIGURG, the sigqueue() system call is introduced by RT
  // signals.  Hence this test won't run on e.g. Mac OSX.
  //
  // Also, Android's bionic does not appear to support sigqueue() even though the kernel does.
  //
  // Also, this test fails on Linux on mipsel. si_value comes back as zero. No one with a mips
  // machine wants to debug the problem but they demand a patch fixing it, so we disable the test.
  // Sad. https://github.com/capnproto/capnproto/issues/204

  if (BROKEN_QEMU) return;

  captureSignals();
  UnixEventPort port;
  EventLoop loop(port);
  WaitScope waitScope(loop);

  union sigval value;
  memset(&value, 0, sizeof(value));
  value.sival_int = 123;
  KJ_SYSCALL_HANDLE_ERRORS(sigqueue(getpid(), SIGURG, value)) {
    case ENOSYS:
      // sigqueue() not supported. Maybe running on WSL.
      KJ_LOG(WARNING, "sigqueue() is not implemented by your system; skipping test");
      return;
    default:
      KJ_FAIL_SYSCALL("sigqueue(getpid(), SIGURG, value)", error);
  }

  siginfo_t info = port.onSignal(SIGURG).wait(waitScope);
  EXPECT_EQ(SIGURG, info.si_signo);
  EXPECT_SI_CODE(SI_QUEUE, info.si_code);
  EXPECT_EQ(123, info.si_value.sival_int);
}